

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

string * duckdb::StringUtil::Repeat(string *__return_storage_ptr__,string *str,idx_t n)

{
  ostringstream os;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  ::std::__cxx11::ostringstream::ostringstream(aoStack_198);
  if (n != 0) {
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_198,(str->_M_dataplus)._M_p,str->_M_string_length);
      n = n - 1;
    } while (n != 0);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  ::std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::Repeat(const string &str, idx_t n) {
	std::ostringstream os;
	for (idx_t i = 0; i < n; i++) {
		os << str;
	}
	return (os.str());
}